

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFTextString.cpp
# Opt level: O2

void __thiscall PDFTextString::ConvertFromUTF8(PDFTextString *this,string *inStringToConvert)

{
  bool bVar1;
  OutputStringBufferStream *this_00;
  UnicodeString unicodeString;
  OutputStringBufferStream aStringStream;
  EStatusCodeAndString result;
  
  this_00 = &aStringStream;
  OutputStringBufferStream::OutputStringBufferStream(&aStringStream);
  bVar1 = ConvertUTF8ToPDFDocEncoding((PDFTextString *)this_00,inStringToConvert,&aStringStream);
  if (bVar1) {
    OutputStringBufferStream::ToString_abi_cxx11_((string *)&result,&aStringStream);
    std::__cxx11::string::operator=((string *)this,(string *)&result);
    std::__cxx11::string::~string((string *)&result);
  }
  else {
    UnicodeString::UnicodeString(&unicodeString);
    UnicodeString::FromUTF8(&unicodeString,inStringToConvert);
    UnicodeString::ToUTF16BE_abi_cxx11_(&result,&unicodeString,true);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::~string((string *)&result.second);
    UnicodeString::~UnicodeString(&unicodeString);
  }
  OutputStringBufferStream::~OutputStringBufferStream(&aStringStream);
  return;
}

Assistant:

void PDFTextString::ConvertFromUTF8(const std::string& inStringToConvert)
{
	OutputStringBufferStream aStringStream;

	if(!ConvertUTF8ToPDFDocEncoding(inStringToConvert,aStringStream))
	{
		// if no DOC encoding then convert to utf16BE (with BOM)
		
		UnicodeString unicodeString;
		unicodeString.FromUTF8(inStringToConvert);
		EStatusCodeAndString result = unicodeString.ToUTF16BE(true);
		
		mTextString = result.second;

	}
	else
	{
		mTextString = aStringStream.ToString();
	}
}